

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numeric.cpp
# Opt level: O1

ScalarFunctionSet * duckdb::BitCountFun::GetFunctions(void)

{
  vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_> *this;
  ScalarFunctionSet *in_RDI;
  initializer_list<duckdb::LogicalType> __l;
  initializer_list<duckdb::LogicalType> __l_00;
  initializer_list<duckdb::LogicalType> __l_01;
  initializer_list<duckdb::LogicalType> __l_02;
  initializer_list<duckdb::LogicalType> __l_03;
  initializer_list<duckdb::LogicalType> __l_04;
  allocator_type local_9b9;
  LogicalType local_9b8 [24];
  ScalarFunctionSet *local_9a0;
  code *local_998;
  undefined8 uStack_990;
  code *local_988;
  code *pcStack_980;
  code *local_978;
  undefined8 uStack_970;
  code *local_968;
  code *pcStack_960;
  code *local_958;
  undefined8 uStack_950;
  code *local_948;
  code *pcStack_940;
  code *local_938;
  undefined8 uStack_930;
  code *local_928;
  code *pcStack_920;
  code *local_918;
  undefined8 uStack_910;
  code *local_908;
  code *pcStack_900;
  code *local_8f8;
  undefined8 uStack_8f0;
  code *local_8e8;
  code *pcStack_8e0;
  LogicalType local_8d0 [24];
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_8b8;
  LogicalType local_8a0 [24];
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_888;
  LogicalType local_870 [24];
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_858;
  LogicalType local_840 [24];
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_828;
  LogicalType local_810 [24];
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_7f8;
  LogicalType local_7e0 [24];
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_7c8;
  LogicalType local_7b0 [24];
  LogicalType local_798 [24];
  LogicalType local_780 [24];
  LogicalType local_768 [24];
  LogicalType local_750 [24];
  LogicalType local_738 [24];
  ScalarFunction local_720;
  ScalarFunction local_5f8;
  ScalarFunction local_4d0;
  ScalarFunction local_3a8;
  ScalarFunction local_280;
  ScalarFunction local_158;
  
  duckdb::ScalarFunctionSet::ScalarFunctionSet(in_RDI);
  local_9a0 = in_RDI;
  duckdb::LogicalType::LogicalType(local_9b8,TINYINT);
  __l._M_len = 1;
  __l._M_array = local_9b8;
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_7c8,__l,&local_9b9);
  duckdb::LogicalType::LogicalType(local_7e0,TINYINT);
  uStack_8f0 = 0;
  local_8f8 = ScalarFunction::UnaryFunction<signed_char,signed_char,duckdb::BitCntOperator>;
  pcStack_8e0 = std::
                _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
                ::_M_invoke;
  local_8e8 = std::
              _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
              ::_M_manager;
  duckdb::LogicalType::LogicalType(local_738,INVALID);
  duckdb::ScalarFunction::ScalarFunction
            (&local_158,&local_7c8,local_7e0,&local_8f8,0,0,0,0,local_738,0,0,0);
  this = (vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_> *)(in_RDI + 0x20);
  std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>(this,&local_158);
  local_158._0_8_ = &PTR__ScalarFunction_008984e0;
  if (local_158.function_info.internal.
      super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_158.function_info.internal.
               super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_158.function.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_158.function.super__Function_base._M_manager)
              ((_Any_data *)((long)&local_158 + 0xb0U),(_Any_data *)((long)&local_158 + 0xb0U),
               __destroy_functor);
  }
  duckdb::BaseScalarFunction::~BaseScalarFunction(&local_158.super_BaseScalarFunction);
  duckdb::LogicalType::~LogicalType(local_738);
  if (local_8e8 != (code *)0x0) {
    (*local_8e8)(&local_8f8,&local_8f8,3);
  }
  duckdb::LogicalType::~LogicalType(local_7e0);
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_7c8);
  duckdb::LogicalType::~LogicalType(local_9b8);
  duckdb::LogicalType::LogicalType(local_9b8,SMALLINT);
  __l_00._M_len = 1;
  __l_00._M_array = local_9b8;
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_7f8,__l_00,&local_9b9);
  duckdb::LogicalType::LogicalType(local_810,TINYINT);
  uStack_910 = 0;
  local_918 = ScalarFunction::UnaryFunction<short,signed_char,duckdb::BitCntOperator>;
  pcStack_900 = std::
                _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
                ::_M_invoke;
  local_908 = std::
              _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
              ::_M_manager;
  duckdb::LogicalType::LogicalType(local_750,INVALID);
  duckdb::ScalarFunction::ScalarFunction
            (&local_280,&local_7f8,local_810,&local_918,0,0,0,0,local_750,0,0,0);
  std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>(this,&local_280);
  local_280._0_8_ = &PTR__ScalarFunction_008984e0;
  if (local_280.function_info.internal.
      super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_280.function_info.internal.
               super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_280.function.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_280.function.super__Function_base._M_manager)
              ((_Any_data *)((long)&local_280 + 0xb0U),(_Any_data *)((long)&local_280 + 0xb0U),
               __destroy_functor);
  }
  duckdb::BaseScalarFunction::~BaseScalarFunction(&local_280.super_BaseScalarFunction);
  duckdb::LogicalType::~LogicalType(local_750);
  if (local_908 != (code *)0x0) {
    (*local_908)(&local_918,&local_918,3);
  }
  duckdb::LogicalType::~LogicalType(local_810);
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_7f8);
  duckdb::LogicalType::~LogicalType(local_9b8);
  duckdb::LogicalType::LogicalType(local_9b8,INTEGER);
  __l_01._M_len = 1;
  __l_01._M_array = local_9b8;
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_828,__l_01,&local_9b9);
  duckdb::LogicalType::LogicalType(local_840,TINYINT);
  uStack_930 = 0;
  local_938 = ScalarFunction::UnaryFunction<int,signed_char,duckdb::BitCntOperator>;
  pcStack_920 = std::
                _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
                ::_M_invoke;
  local_928 = std::
              _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
              ::_M_manager;
  duckdb::LogicalType::LogicalType(local_768,INVALID);
  duckdb::ScalarFunction::ScalarFunction
            (&local_3a8,&local_828,local_840,&local_938,0,0,0,0,local_768,0,0,0);
  std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>(this,&local_3a8);
  local_3a8._0_8_ = &PTR__ScalarFunction_008984e0;
  if (local_3a8.function_info.internal.
      super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_3a8.function_info.internal.
               super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_3a8.function.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_3a8.function.super__Function_base._M_manager)
              ((_Any_data *)((long)&local_3a8 + 0xb0U),(_Any_data *)((long)&local_3a8 + 0xb0U),
               __destroy_functor);
  }
  duckdb::BaseScalarFunction::~BaseScalarFunction(&local_3a8.super_BaseScalarFunction);
  duckdb::LogicalType::~LogicalType(local_768);
  if (local_928 != (code *)0x0) {
    (*local_928)(&local_938,&local_938,3);
  }
  duckdb::LogicalType::~LogicalType(local_840);
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_828);
  duckdb::LogicalType::~LogicalType(local_9b8);
  duckdb::LogicalType::LogicalType(local_9b8,BIGINT);
  __l_02._M_len = 1;
  __l_02._M_array = local_9b8;
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_858,__l_02,&local_9b9);
  duckdb::LogicalType::LogicalType(local_870,TINYINT);
  uStack_950 = 0;
  local_958 = ScalarFunction::UnaryFunction<long,signed_char,duckdb::BitCntOperator>;
  pcStack_940 = std::
                _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
                ::_M_invoke;
  local_948 = std::
              _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
              ::_M_manager;
  duckdb::LogicalType::LogicalType(local_780,INVALID);
  duckdb::ScalarFunction::ScalarFunction
            (&local_4d0,&local_858,local_870,&local_958,0,0,0,0,local_780,0,0,0);
  std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>(this,&local_4d0);
  local_4d0._0_8_ = &PTR__ScalarFunction_008984e0;
  if (local_4d0.function_info.internal.
      super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_4d0.function_info.internal.
               super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_4d0.function.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_4d0.function.super__Function_base._M_manager)
              ((_Any_data *)((long)&local_4d0 + 0xb0U),(_Any_data *)((long)&local_4d0 + 0xb0U),
               __destroy_functor);
  }
  duckdb::BaseScalarFunction::~BaseScalarFunction(&local_4d0.super_BaseScalarFunction);
  duckdb::LogicalType::~LogicalType(local_780);
  if (local_948 != (code *)0x0) {
    (*local_948)(&local_958,&local_958,3);
  }
  duckdb::LogicalType::~LogicalType(local_870);
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_858);
  duckdb::LogicalType::~LogicalType(local_9b8);
  duckdb::LogicalType::LogicalType(local_9b8,HUGEINT);
  __l_03._M_len = 1;
  __l_03._M_array = local_9b8;
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_888,__l_03,&local_9b9);
  duckdb::LogicalType::LogicalType(local_8a0,TINYINT);
  uStack_970 = 0;
  local_978 = ScalarFunction::
              UnaryFunction<duckdb::hugeint_t,signed_char,duckdb::HugeIntBitCntOperator>;
  pcStack_960 = std::
                _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
                ::_M_invoke;
  local_968 = std::
              _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
              ::_M_manager;
  duckdb::LogicalType::LogicalType(local_798,INVALID);
  duckdb::ScalarFunction::ScalarFunction
            (&local_5f8,&local_888,local_8a0,&local_978,0,0,0,0,local_798,0,0,0);
  std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>(this,&local_5f8);
  local_5f8._0_8_ = &PTR__ScalarFunction_008984e0;
  if (local_5f8.function_info.internal.
      super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_5f8.function_info.internal.
               super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_5f8.function.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_5f8.function.super__Function_base._M_manager)
              ((_Any_data *)((long)&local_5f8 + 0xb0U),(_Any_data *)((long)&local_5f8 + 0xb0U),
               __destroy_functor);
  }
  duckdb::BaseScalarFunction::~BaseScalarFunction(&local_5f8.super_BaseScalarFunction);
  duckdb::LogicalType::~LogicalType(local_798);
  if (local_968 != (code *)0x0) {
    (*local_968)(&local_978,&local_978,3);
  }
  duckdb::LogicalType::~LogicalType(local_8a0);
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_888);
  duckdb::LogicalType::~LogicalType(local_9b8);
  duckdb::LogicalType::LogicalType(local_9b8,BIT);
  __l_04._M_len = 1;
  __l_04._M_array = local_9b8;
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_8b8,__l_04,&local_9b9);
  duckdb::LogicalType::LogicalType(local_8d0,BIGINT);
  uStack_990 = 0;
  local_998 = ScalarFunction::
              UnaryFunction<duckdb::string_t,unsigned_long,duckdb::BitStringBitCntOperator>;
  pcStack_980 = std::
                _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
                ::_M_invoke;
  local_988 = std::
              _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
              ::_M_manager;
  duckdb::LogicalType::LogicalType(local_7b0,INVALID);
  duckdb::ScalarFunction::ScalarFunction
            (&local_720,&local_8b8,local_8d0,&local_998,0,0,0,0,local_7b0,0,0,0);
  std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>(this,&local_720);
  local_720._0_8_ = &PTR__ScalarFunction_008984e0;
  if (local_720.function_info.internal.
      super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_720.function_info.internal.
               super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_720.function.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_720.function.super__Function_base._M_manager)
              ((_Any_data *)((long)&local_720 + 0xb0U),(_Any_data *)((long)&local_720 + 0xb0U),
               __destroy_functor);
  }
  duckdb::BaseScalarFunction::~BaseScalarFunction(&local_720.super_BaseScalarFunction);
  duckdb::LogicalType::~LogicalType(local_7b0);
  if (local_988 != (code *)0x0) {
    (*local_988)(&local_998,&local_998,3);
  }
  duckdb::LogicalType::~LogicalType(local_8d0);
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_8b8);
  duckdb::LogicalType::~LogicalType(local_9b8);
  return local_9a0;
}

Assistant:

ScalarFunctionSet BitCountFun::GetFunctions() {
	ScalarFunctionSet functions;
	functions.AddFunction(ScalarFunction({LogicalType::TINYINT}, LogicalType::TINYINT,
	                                     ScalarFunction::UnaryFunction<int8_t, int8_t, BitCntOperator>));
	functions.AddFunction(ScalarFunction({LogicalType::SMALLINT}, LogicalType::TINYINT,
	                                     ScalarFunction::UnaryFunction<int16_t, int8_t, BitCntOperator>));
	functions.AddFunction(ScalarFunction({LogicalType::INTEGER}, LogicalType::TINYINT,
	                                     ScalarFunction::UnaryFunction<int32_t, int8_t, BitCntOperator>));
	functions.AddFunction(ScalarFunction({LogicalType::BIGINT}, LogicalType::TINYINT,
	                                     ScalarFunction::UnaryFunction<int64_t, int8_t, BitCntOperator>));
	functions.AddFunction(ScalarFunction({LogicalType::HUGEINT}, LogicalType::TINYINT,
	                                     ScalarFunction::UnaryFunction<hugeint_t, int8_t, HugeIntBitCntOperator>));
	functions.AddFunction(ScalarFunction({LogicalType::BIT}, LogicalType::BIGINT,
	                                     ScalarFunction::UnaryFunction<string_t, idx_t, BitStringBitCntOperator>));
	return functions;
}